

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

void __thiscall Arcflow::finalize(Arcflow *this)

{
  NodeSet *this_00;
  vector<Arc,_std::allocator<Arc>_> *this_01;
  vector<int,_std::allocator<int>_> *u;
  pointer pvVar1;
  int *piVar2;
  int *piVar3;
  pointer piVar4;
  pointer pIVar5;
  pointer pAVar6;
  pointer __last;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  runtime_error *this_02;
  ulong uVar11;
  int i;
  int iVar12;
  iterator __end1;
  size_t __n;
  pointer pAVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int *piVar15;
  vector<int,_std::allocator<int>_> *W;
  int *piVar16;
  int i_2;
  int i_1;
  long lVar17;
  size_type sVar18;
  reference rVar19;
  _Vector_base<int,_std::allocator<int>_> local_198;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bigger_than;
  Arc local_164;
  vector<int,_std::allocator<int>_> torder;
  char _error_msg_ [256];
  
  if (this->ready != false) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1b9);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,_error_msg_);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar12 = (this->inst).nbtypes;
  this->S = 0;
  if (iVar12 == 1) {
    _error_msg_._0_4_ = NodeSet::size(&this->NS);
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&this->Ts,(Arc *)_error_msg_);
    _error_msg_._8_4_ = this->LOSS;
    _error_msg_._0_4_ =
         *(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    _error_msg_._4_4_ = this->S;
    std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(&this->A,(Arc *)_error_msg_);
    iVar12 = 1;
    while( true ) {
      iVar8 = NodeSet::size(&this->NS);
      if (iVar8 <= iVar12) break;
      _error_msg_._8_4_ = this->LOSS;
      _error_msg_._4_4_ =
           *(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
      _error_msg_._0_4_ = iVar12;
      std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(&this->A,(Arc *)_error_msg_);
      iVar12 = iVar12 + 1;
    }
  }
  else {
    torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    for (_error_msg_._0_4_ = 0;
        __last = torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        piVar4 = torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, (int)_error_msg_._0_4_ < iVar12;
        _error_msg_._0_4_ = _error_msg_._0_4_ + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(&torder,(value_type *)_error_msg_);
      iVar12 = (this->inst).nbtypes;
    }
    if (torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      lVar14 = (long)torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar9 = lVar14 >> 2;
      lVar17 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar17 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                  )this);
      if (lVar14 < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar4,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
      }
      else {
        __last_00._M_current = piVar4 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar4,
                   __last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
        for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<Arcflow::finalize()::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                      )this);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)(this->inst).nbtypes);
    this_00 = &this->NS;
    for (lVar17 = 0; uVar9 = (ulong)(this->inst).nbtypes, lVar17 < (long)uVar9; lVar17 = lVar17 + 1)
    {
      iVar12 = NodeSet::size(this_00);
      (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar17]] = iVar12 + (int)lVar17;
    }
    this_01 = &this->A;
    for (lVar17 = 0; lVar17 < (int)uVar9; lVar17 = lVar17 + 1) {
      _error_msg_._8_4_ = this->LOSS;
      _error_msg_._0_4_ =
           (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar17];
      _error_msg_._4_4_ = this->S;
      std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(this_01,(Arc *)_error_msg_);
      uVar9 = (ulong)(uint)(this->inst).nbtypes;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&bigger_than,(long)(int)uVar9,(allocator_type *)_error_msg_);
    iVar12 = (this->inst).nbtypes;
    iVar8 = 1;
    for (uVar9 = 0; (long)uVar9 < (long)iVar12; uVar9 = uVar9 + 1) {
      uVar11 = 0;
      while( true ) {
        _error_msg_._0_4_ = (undefined4)uVar11;
        if (iVar12 <= (int)_error_msg_._0_4_) break;
        if (uVar9 != uVar11) {
          pvVar1 = (this->inst).Ws.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          u = pvVar1 + uVar9;
          W = pvVar1 + (int)_error_msg_._0_4_;
          bVar7 = is_valid(this,u,W);
          if (bVar7) {
            bVar7 = std::operator!=(u,W);
            if (bVar7) {
LAB_00108af5:
              std::vector<int,_std::allocator<int>_>::push_back
                        (bigger_than.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar9,(value_type *)_error_msg_
                        );
            }
            else if ((long)uVar9 < (long)(int)_error_msg_._0_4_) {
              pvVar1 = (this->inst).Ws.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar7 = std::operator==(pvVar1 + uVar9,pvVar1 + (int)_error_msg_._0_4_);
              if (bVar7) goto LAB_00108af5;
            }
          }
        }
        uVar11 = (ulong)(_error_msg_._0_4_ + 1);
        iVar12 = (this->inst).nbtypes;
      }
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)_error_msg_,(long)iVar12,
               (allocator_type *)&local_198);
    while( true ) {
      iVar12 = NodeSet::size(this_00);
      if (iVar12 <= iVar8) break;
      NodeSet::get_label((vector<int,_std::allocator<int>_> *)&local_198,this_00,iVar8);
      lVar17 = 0;
      for (sVar18 = 0; uVar9 = (ulong)(this->inst).nbtypes, (long)sVar18 < (long)uVar9;
          sVar18 = sVar18 + 1) {
        bVar7 = is_valid(this,(vector<int,_std::allocator<int>_> *)&local_198,
                         (vector<int,_std::allocator<int>_> *)
                         ((long)&(((this->inst).Ws.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + lVar17));
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,sVar18);
        puVar10 = rVar19._M_p;
        if (bVar7) {
          uVar9 = rVar19._M_mask | *puVar10;
        }
        else {
          uVar9 = ~rVar19._M_mask & *puVar10;
        }
        *puVar10 = uVar9;
        lVar17 = lVar17 + 0x18;
      }
      for (sVar18 = 0; (long)sVar18 < (long)(int)uVar9; sVar18 = sVar18 + 1) {
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,sVar18);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          piVar2 = bigger_than.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar18].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          for (piVar15 = bigger_than.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar18].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar15 != piVar2; piVar15 = piVar15 + 1)
          {
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)_error_msg_,(long)*piVar15);
            *rVar19._M_p = *rVar19._M_p & ~rVar19._M_mask;
          }
        }
        uVar9 = (ulong)(uint)(this->inst).nbtypes;
      }
      for (sVar18 = 0; (long)sVar18 < (long)(int)uVar9; sVar18 = sVar18 + 1) {
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,sVar18);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          local_164.label = this->LOSS;
          local_164.v = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar18];
          local_164.u = iVar8;
          std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(this_01,&local_164);
        }
        uVar9 = (ulong)(uint)(this->inst).nbtypes;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_198);
      iVar8 = iVar8 + 1;
    }
    for (lVar17 = 0; __n = (size_t)(this->inst).nbtypes, lVar17 < (long)__n; lVar17 = lVar17 + 1) {
      std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                ((vector<bool,_std::allocator<bool>_> *)_error_msg_,__n,false);
      piVar2 = bigger_than.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar15 = bigger_than.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar15 != piVar2; piVar15 = piVar15 + 1) {
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,(long)*piVar15);
        *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
      }
      piVar2 = bigger_than.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar15 = bigger_than.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar15 != piVar2; piVar15 = piVar15 + 1) {
        sVar18 = (size_type)*piVar15;
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,sVar18);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          piVar3 = bigger_than.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar18].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          for (piVar16 = bigger_than.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar18].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar16 != piVar3; piVar16 = piVar16 + 1)
          {
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)_error_msg_,(long)*piVar16);
            *rVar19._M_p = *rVar19._M_p & ~rVar19._M_mask;
          }
        }
      }
      piVar2 = bigger_than.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar15 = bigger_than.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar15 != piVar2; piVar15 = piVar15 + 1) {
        iVar12 = *piVar15;
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)_error_msg_,(long)iVar12);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          piVar4 = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_198._M_impl.super__Vector_impl_data._M_finish._0_4_ = this->LOSS;
          local_198._M_impl.super__Vector_impl_data._M_start._0_4_ = piVar4[lVar17];
          local_198._M_impl.super__Vector_impl_data._M_start._4_4_ = piVar4[iVar12];
          std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(this_01,(Arc *)&local_198);
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)_error_msg_);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&bigger_than);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&torder.super__Vector_base<int,_std::allocator<int>_>);
  }
  reduce_redundancy(this);
  iVar12 = NodeSet::size(&this->NS);
  pIVar5 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->NV = (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) + iVar12;
  pAVar6 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pAVar13 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_start;
  this->NA = (int)(((long)pAVar6 - (long)pAVar13) / 0xc);
  iVar12 = this->LOSS;
  for (; pAVar13 != pAVar6; pAVar13 = pAVar13 + 1) {
    if (pAVar13->label != iVar12) {
      pAVar13->label = pIVar5[pAVar13->label].id;
    }
  }
  this->ready = true;
  return;
}

Assistant:

void Arcflow::finalize() {
	throw_assert(ready == false);
	if (inst.nbtypes == 1) {
		S = 0;
		Ts.assign({NS.size()});
		A.push_back(Arc(Ts[0], S, LOSS));
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			A.push_back(Arc(i, Ts[0], LOSS));
		}
	} else {
		S = 0;
		std::vector<int> torder;
		for (int i = 0; i < inst.nbtypes; i++) {
			torder.push_back(i);
		}
		sort(all(torder), [this](int a, int b) {
			return this->inst.Ws[a] < this->inst.Ws[b];
		});
		Ts.resize(inst.nbtypes);
		for (int i = 0; i < inst.nbtypes; i++) {
			Ts[torder[i]] = NS.size() + i;
		}
		for (int i = 0; i < inst.nbtypes; i++) {
			A.push_back(Arc(Ts[i], S, LOSS));
		}

		std::vector<std::vector<int>> bigger_than(inst.nbtypes);
		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			for (int t2 = 0; t2 < inst.nbtypes; t2++) {
				if (t1 != t2 && is_valid(inst.Ws[t1], inst.Ws[t2])) {
					if (inst.Ws[t1] != inst.Ws[t2] ||
						(t1 < t2 && inst.Ws[t1] == inst.Ws[t2])) {
						bigger_than[t1].push_back(t2);
					}
				}
			}
		}

		std::vector<bool> valid_tgts(inst.nbtypes);
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			const std::vector<int> &u = NS.get_label(i);
			for (int t = 0; t < inst.nbtypes; t++) {
				valid_tgts[t] = is_valid(u, inst.Ws[t]);
			}
			for (int t1 = 0; t1 < inst.nbtypes; t1++) {
				if (valid_tgts[t1]) {
					for (int t2 : bigger_than[t1]) {
						valid_tgts[t2] = false;
					}
				}
			}
			for (int t = 0; t < inst.nbtypes; t++) {
				if (valid_tgts[t]) {
					A.push_back(Arc(i, Ts[t], LOSS));
				}
			}
		}

		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			valid_tgts.assign(inst.nbtypes, false);
			for (int t2 : bigger_than[t1]) {
				valid_tgts[t2] = true;
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					for (int t3 : bigger_than[t2]) {
						valid_tgts[t3] = false;
					}
				}
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					A.push_back(Arc(Ts[t1], Ts[t2], LOSS));
				}
			}
		}
	}
	reduce_redundancy();
	NV = NS.size() + Ts.size();
	NA = A.size();
	for (Arc &a : A) {
		if (a.label != LOSS) {
			a.label = sitems[a.label].id;
		}
	}
	ready = true;
}